

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  size_t *psVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  size_type sVar10;
  reference pbVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  __cxx11 local_520 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500 [32];
  __cxx11 local_4e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0 [32];
  ulong local_4a0;
  size_t j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478 [32];
  string local_458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8 [32];
  ulong local_3d8;
  size_t i_3;
  iterator name_iter;
  iterator iter;
  string local_3b8 [8];
  string tmp;
  cryptor local_398 [32];
  string *local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *iter_3;
  iterator __end1;
  iterator __begin1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  value_type local_338 [32];
  ulong local_318;
  size_t i_2;
  ulong local_308;
  size_t i_1;
  string local_2f8 [8];
  string tmp_1;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d8;
  iterator iter_2;
  string local_2c8 [6];
  char ans;
  bool set;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> iter_1;
  _Self local_2a8;
  iterator __end2;
  iterator __begin2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_288 [32];
  undefined4 local_268;
  int local_254;
  undefined1 local_250 [4];
  int i;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s_name;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  c_word;
  ofstream fout;
  byte local_1a;
  byte local_19;
  bool ask_name;
  bool f_out;
  bool debug;
  char **ppcStack_18;
  bool mode;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "                                    _             \tVersion : ");
  poVar9 = std::operator<<(poVar9,(string *)str_ver_abi_cxx11_);
  std::operator<<(poVar9,"\n");
  std::operator<<((ostream *)&std::cout,"   ||  ||      ___ _ __ _   _ _ __ | |_ ___  _ __ \n");
  std::operator<<((ostream *)&std::cout,
                  "   \\\\()//    / __| \'__| | | | \'_ \\| __/ _ \\| \'__|\tDeveloper : KonstantIMP\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "  //(__)\\\\  | (__| |  | |_| | |_) | || (_) | |   \tFeedback email : mihedovkos@gmail.com\n"
                 );
  std::operator<<((ostream *)&std::cout,"  ||    ||   \\___|_|   \\__, | .__/ \\__\\___/|_|   \n");
  std::operator<<((ostream *)&std::cout,
                  "                       |___/|_|                  \tUse \"cryptor -h\" to view help message\n\n"
                 );
  if ((int)argv_local == 1) {
    argv_local._4_4_ = 0;
  }
  else {
    local_19 = 0;
    local_1a = 0;
    bVar2 = false;
    bVar7 = true;
    std::ofstream::ofstream
              (&c_word.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&s_name.
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl._M_node._M_size);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_250);
    for (local_254 = 1; local_254 < (int)argv_local; local_254 = local_254 + 1) {
      iVar8 = strcmp(ppcStack_18[local_254],"-h");
      if (iVar8 == 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"CRYPTOR : version ");
        poVar9 = std::operator<<(poVar9,(string *)str_ver_abi_cxx11_);
        std::operator<<(poVar9,"\n\n");
        std::operator<<((ostream *)&std::cout,
                        "Cryptor is a simple programm, to encrypt & decrypt text messages\n\n");
        std::operator<<((ostream *)&std::cout,"HELP MANUAL :\n");
        std::operator<<((ostream *)&std::cout,"\t[USAGE] encryptor [OPTIONS] [WORDS]\n\n");
        std::operator<<((ostream *)&std::cout,"[OPTIONS]\n");
        std::operator<<((ostream *)&std::cout,"\t-d\tView debug output\n");
        std::operator<<((ostream *)&std::cout,"\t-v\tView version and exit\n");
        std::operator<<((ostream *)&std::cout,"\t-h\tView help message and exit\n");
        std::operator<<((ostream *)&std::cout,"\t-a\tView (en/de)crypt algorithm and exit\n");
        std::operator<<((ostream *)&std::cout,"\t-t\tDon\'t ask about stings names\n");
        std::operator<<((ostream *)&std::cout,"\t-o [F]\tSet output file\n\n");
        std::operator<<((ostream *)&std::cout,"\t-m [M]\tSet output strings style\n");
        std::operator<<((ostream *)&std::cout,"\t[STRING STYLE MODES]\n");
        std::operator<<((ostream *)&std::cout,"\t\tC\tUse c-style strings\n");
        std::operator<<((ostream *)&std::cout,"\t\tCPP\tUse cpp STL strings\n");
        argv_local._4_4_ = 0;
        local_268 = 1;
        goto LAB_00103c03;
      }
      iVar8 = strcmp(ppcStack_18[local_254],"-v");
      if (iVar8 == 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Version is : ");
        poVar9 = std::operator<<(poVar9,(string *)str_ver_abi_cxx11_);
        std::operator<<(poVar9,'\n');
        argv_local._4_4_ = 0;
        local_268 = 1;
        goto LAB_00103c03;
      }
      iVar8 = strcmp(ppcStack_18[local_254],"-d");
      if (iVar8 == 0) {
        local_1a = 1;
      }
      else {
        iVar8 = strcmp(ppcStack_18[local_254],"-a");
        if (iVar8 == 0) {
          std::operator<<((ostream *)&std::cout,"Encrytion & Decryption algorithm :\n\n");
          std::operator<<((ostream *)&std::cout,
                          "[DESCRIPTION] As an argument we get a text message in the form of a string :\n"
                         );
          std::operator<<((ostream *)&std::cout,"\t\tstring text_msg = \"Hello, World!\"\n\n");
          std::operator<<((ostream *)&std::cout,
                          "[DESCRIPTION] By definition string is a characters array\n");
          std::operator<<((ostream *)&std::cout,"\t\t[ 0] = \'H\'\t [ 7] = \'W\'\n");
          std::operator<<((ostream *)&std::cout,"\t\t[ 1] = \'e\'\t [ 8] = \'o\'\n");
          std::operator<<((ostream *)&std::cout,"\t\t[ 2] = \'l\'\t [ 9] = \'r\'\n");
          std::operator<<((ostream *)&std::cout,"\t\t[ 3] = \'l\'\t [10] = \'l\'\n");
          std::operator<<((ostream *)&std::cout,"\t\t[ 4] = \'o\'\t [11] = \'d\'\n");
          std::operator<<((ostream *)&std::cout,"\t\t[ 5] = \',\'\t [12] = \'!\'\n");
          std::operator<<((ostream *)&std::cout,"\t\t[ 6] = \' \'\n\n");
          std::operator<<((ostream *)&std::cout,
                          "[DESCRIPTION] Encryption & Decryption is performed one character at a time\n\n"
                         );
          std::operator<<((ostream *)&std::cout,
                          "[DESCRIPTION] Two auxiliary unsigned character variables were created for Encryption & Decryption\n"
                         );
          std::operator<<((ostream *)&std::cout,"\t\tunsigned char a, b;\n\n");
          std::operator<<((ostream *)&std::cout,
                          "[DESCRIPTION] The following actions are performed for each character\n");
          std::operator<<((ostream *)&std::cout,"\t\ta = b = text_msg[n]\n");
          std::operator<<((ostream *)&std::cout,"\t\ta = a << 4\n");
          std::operator<<((ostream *)&std::cout,"\t\tb = b >> 4\n");
          std::operator<<((ostream *)&std::cout,"\t\ta = b = ~(a | b) - 1\n");
          std::operator<<((ostream *)&std::cout,"\t\ta = a << 4\n");
          std::operator<<((ostream *)&std::cout,"\t\tb = b >> 4\n");
          std::operator<<((ostream *)&std::cout,"\t\tresult = a | b\n\n");
          std::operator<<((ostream *)&std::cout,
                          "[DESCRIPTION] The Encryption or Decryption results for each character form the source string\n"
                         );
          argv_local._4_4_ = 0;
          local_268 = 1;
          goto LAB_00103c03;
        }
        iVar8 = strcmp(ppcStack_18[local_254],"-t");
        if (iVar8 == 0) {
          bVar7 = false;
        }
        else {
          iVar8 = strcmp(ppcStack_18[local_254],"-m");
          if (iVar8 == 0) {
            local_254 = local_254 + 1;
            iVar8 = strcmp(ppcStack_18[local_254],"C");
            if (iVar8 == 0) {
              local_19 = 0;
            }
            else {
              iVar8 = strcmp(ppcStack_18[local_254],"CPP");
              if (iVar8 != 0) {
                std::operator<<((ostream *)&std::cout,"[ERROR] Incorrect string style mode\n");
                argv_local._4_4_ = 1;
                local_268 = 1;
                goto LAB_00103c03;
              }
              local_19 = 1;
            }
          }
          else {
            iVar8 = strcmp(ppcStack_18[local_254],"-o");
            if (iVar8 == 0) {
              if (bVar2) {
                std::operator<<((ostream *)&std::cout,"You can use only one output file\n");
                argv_local._4_4_ = 2;
                local_268 = 1;
                goto LAB_00103c03;
              }
              bVar2 = true;
              local_254 = local_254 + 1;
              std::ofstream::open((char *)&c_word.
                                           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl._M_node._M_size,
                                  (_Ios_Openmode)ppcStack_18[local_254]);
              bVar5 = std::ofstream::is_open();
              if ((bVar5 & 1) == 0) {
                std::operator<<((ostream *)&std::cout,"Can\'t create or open output file\n");
              }
            }
            else {
              pcVar14 = ppcStack_18[local_254];
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_288,pcVar14,(allocator *)((long)&__range2 + 7));
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s_name.
                              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl._M_node._M_size,(value_type *)local_288);
              std::__cxx11::string::~string(local_288);
              std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
            }
          }
        }
      }
    }
    if ((local_1a & 1) != 0) {
      std::operator<<((ostream *)&std::clog,"[DEBUG] Debug output is ON\n\n");
    }
    if ((local_1a & 1) != 0) {
      poVar9 = std::operator<<((ostream *)&std::clog,"[DEBUG] String mode : ");
      pcVar14 = "C\n\n";
      if ((local_19 & 1) != 0) {
        pcVar14 = "CPP\n\n";
      }
      std::operator<<(poVar9,pcVar14);
    }
    if ((local_1a & 1) != 0) {
      poVar9 = std::operator<<((ostream *)&std::clog,"[DEBUG] Output to file is ");
      pcVar14 = "OFF\n\n";
      if (bVar2) {
        pcVar14 = "ON\n\n";
      }
      std::operator<<(poVar9,pcVar14);
    }
    if ((local_1a & 1) != 0) {
      std::operator<<((ostream *)&std::clog,"[DEBUG] Words analisys\n");
      psVar1 = &s_name.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
      __end2 = std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)psVar1);
      local_2a8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)psVar1);
      while (bVar6 = std::operator!=(&__end2,&local_2a8), bVar6) {
        pbVar11 = std::
                  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end2);
        std::__cxx11::string::string(local_2c8,(string *)pbVar11);
        poVar9 = std::operator<<((ostream *)&std::clog,'\t');
        poVar9 = std::operator<<(poVar9,local_2c8);
        std::operator<<(poVar9,'\n');
        std::__cxx11::string::~string(local_2c8);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
    }
    if (bVar7) {
      iter_2._M_node._7_1_ = 0;
      iter_2._M_node._6_1_ = '\0';
      do {
        std::operator<<((ostream *)&std::cout,"\nDo you want to set names for strings[y/n] : ");
        iVar8 = _getch();
        iter_2._M_node._6_1_ = (char)iVar8;
        if (iter_2._M_node._6_1_ == 'n') {
          bVar7 = false;
          iter_2._M_node._7_1_ = 1;
        }
        else if ((iter_2._M_node._6_1_ == 'y') || (iter_2._M_node._6_1_ == ' ')) {
          iter_2._M_node._7_1_ = 1;
        }
        else {
          std::operator<<((ostream *)&std::cout,"Incorrect Answer! Try again!\n\n");
        }
      } while ((iter_2._M_node._7_1_ & 1) == 0);
    }
    if (bVar7) {
      local_2d8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&s_name.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node._M_size);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f8,"",(allocator *)((long)&i_1 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
      for (local_308 = 0; uVar3 = local_308,
          sVar10 = std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s_name.
                              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl._M_node._M_size), uVar3 < sVar10; local_308 = local_308 + 1)
      {
        poVar9 = std::operator<<((ostream *)&std::cout,"\nEnter name for ");
        pbVar11 = std::
                  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_2d8);
        poVar9 = std::operator<<(poVar9,(string *)pbVar11);
        std::operator<<(poVar9," : ");
        std::operator>>((istream *)&std::cin,local_2f8);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_250,(value_type *)local_2f8);
        i_2 = (size_t)std::
                      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator++(&local_2d8,0);
      }
      std::__cxx11::string::~string(local_2f8);
    }
    else {
      for (local_318 = 0; uVar3 = local_318,
          sVar10 = std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&s_name.
                              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl._M_node._M_size), uVar3 < sVar10; local_318 = local_318 + 1)
      {
        std::__cxx11::to_string((__cxx11 *)&__range1,local_318);
        std::operator+((char *)local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"str");
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_250,local_338);
        std::__cxx11::string::~string((string *)local_338);
        std::__cxx11::string::~string((string *)&__range1);
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    if ((local_1a & 1) != 0) {
      std::operator<<((ostream *)&std::clog,"[DEBUG] Starting crypt\n\n");
    }
    psVar1 = &s_name.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
    __end1 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)psVar1);
    iter_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)psVar1);
    while (bVar7 = std::operator!=(&__end1,(_Self *)&iter_3), bVar7) {
      local_378 = (string *)
                  std::
                  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end1);
      cryptor::crypt(local_398,(char *)local_378,(char *)&local_1a);
      std::__cxx11::string::operator=(local_378,(string *)local_398);
      std::__cxx11::string::~string((string *)local_398);
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    if ((local_1a & 1) != 0) {
      std::operator<<((ostream *)&std::clog,"[DEBUG] Crypt result\n");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"",(allocator *)((long)&iter._M_node + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&iter._M_node + 7));
    name_iter = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&s_name.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node._M_size);
    i_3 = (size_t)std::__cxx11::
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_250);
    for (local_3d8 = 0; uVar3 = local_3d8,
        sVar10 = std::__cxx11::
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&s_name.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node._M_size), uVar3 < sVar10; local_3d8 = local_3d8 + 1) {
      poVar9 = std::operator<<((ostream *)&std::clog,'\t');
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_3d8 + 1);
      std::operator<<(poVar9,"th - ");
      if ((local_19 & 1) == 0) {
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&i_3);
        std::operator+((char *)&j,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"char ")
        ;
        std::operator+(local_478,(char *)&j);
        std::__cxx11::string::operator=(local_3b8,(string *)local_478);
        std::__cxx11::string::~string((string *)local_478);
        std::__cxx11::string::~string((string *)&j);
        local_4a0 = 0;
        while( true ) {
          uVar3 = local_4a0;
          std::
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&name_iter);
          uVar12 = std::__cxx11::string::length();
          uVar4 = local_4a0;
          if (uVar12 <= uVar3) break;
          std::
          _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&name_iter);
          lVar13 = std::__cxx11::string::length();
          if (uVar4 == lVar13 - 1U) {
            pbVar11 = std::
                      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&name_iter);
            pcVar14 = (char *)std::__cxx11::string::at((ulong)pbVar11);
            std::__cxx11::to_string(local_520,(int)*pcVar14);
            std::operator+(local_500,(char *)local_520);
            std::__cxx11::string::operator+=(local_3b8,(string *)local_500);
            std::__cxx11::string::~string((string *)local_500);
            std::__cxx11::string::~string((string *)local_520);
          }
          else {
            pbVar11 = std::
                      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&name_iter);
            pcVar14 = (char *)std::__cxx11::string::at((ulong)pbVar11);
            std::__cxx11::to_string(local_4e0,(int)*pcVar14);
            std::operator+(local_4c0,(char *)local_4e0);
            std::__cxx11::string::operator+=(local_3b8,(string *)local_4c0);
            std::__cxx11::string::~string((string *)local_4c0);
            std::__cxx11::string::~string((string *)local_4e0);
          }
          local_4a0 = local_4a0 + 1;
        }
      }
      else {
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&i_3);
        std::operator+((char *)local_458,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "std::string ");
        std::operator+(local_438,(char *)local_458);
        std::
        _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&name_iter);
        std::operator+(local_418,local_438);
        std::operator+(local_3f8,(char *)local_418);
        std::__cxx11::string::operator=(local_3b8,(string *)local_3f8);
        std::__cxx11::string::~string((string *)local_3f8);
        std::__cxx11::string::~string((string *)local_418);
        std::__cxx11::string::~string((string *)local_438);
        std::__cxx11::string::~string(local_458);
      }
      poVar9 = std::operator<<((ostream *)&std::clog,local_3b8);
      std::operator<<(poVar9,'\n');
      if (bVar2) {
        poVar9 = std::operator<<((ostream *)
                                 &c_word.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node._M_size,local_3b8);
        std::operator<<(poVar9,'\n');
      }
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&name_iter,0);
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&i_3,0);
    }
    if (bVar2) {
      std::ofstream::close();
    }
    argv_local._4_4_ = 0;
    local_268 = 1;
    std::__cxx11::string::~string(local_3b8);
LAB_00103c03:
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_250);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&s_name.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size);
    std::ofstream::~ofstream
              (&c_word.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char * argv[]) {
    std::cout << "                                    _             \tVersion : " << str_ver << "\n";
    std::cout << "   ||  ||      ___ _ __ _   _ _ __ | |_ ___  _ __ \n";
    std::cout << "   \\\\()//    / __| '__| | | | '_ \\| __/ _ \\| '__|\tDeveloper : KonstantIMP\n";
    std::cout << "  //(__)\\\\  | (__| |  | |_| | |_) | || (_) | |   \tFeedback email : mihedovkos@gmail.com\n";
    std::cout << "  ||    ||   \\___|_|   \\__, | .__/ \\__\\___/|_|   \n";
    std::cout << "                       |___/|_|                  \tUse \"cryptor -h\" to view help message\n\n";

    if(argc == 1) {
        return 0;
    }

    bool mode = 0;
    bool debug = 0;
    bool f_out = 0;
    bool ask_name = true;

    std::ofstream fout;

    std::list<std::string> c_word;
    std::list<std::string> s_name;

    for(int i{1}; i < argc; i++) {
        if(strcmp(argv[i], "-h") == 0) {
            std::cout << "CRYPTOR : version " << str_ver << "\n\n";

            std::cout << "Cryptor is a simple programm, to encrypt & decrypt text messages\n\n";

            std::cout << "HELP MANUAL :\n";
            std::cout << "\t[USAGE] encryptor [OPTIONS] [WORDS]\n\n";

            std::cout << "[OPTIONS]\n";
            std::cout << "\t-d\tView debug output\n";
            std::cout << "\t-v\tView version and exit\n";
            std::cout << "\t-h\tView help message and exit\n";
            std::cout << "\t-a\tView (en/de)crypt algorithm and exit\n";
            std::cout << "\t-t\tDon't ask about stings names\n";

            std::cout << "\t-o [F]\tSet output file\n\n";

            std::cout << "\t-m [M]\tSet output strings style\n";

            std::cout << "\t[STRING STYLE MODES]\n";
            std::cout << "\t\tC\tUse c-style strings\n";
            std::cout << "\t\tCPP\tUse cpp STL strings\n";

            return 0;
        }
        if(strcmp(argv[i], "-v") == 0) {
            std::cout << "Version is : " << str_ver << '\n';
            return 0;
        }
        if(strcmp(argv[i], "-d") == 0) {
            debug = true; continue;
        }
        if(strcmp(argv[i], "-a") == 0) {
            std::cout << "Encrytion & Decryption algorithm :\n\n";

            std::cout << "[DESCRIPTION] As an argument we get a text message in the form of a string :\n";
            std::cout << "\t\tstring text_msg = \"Hello, World!\"\n\n";

            std::cout << "[DESCRIPTION] By definition string is a characters array\n";
            std::cout << "\t\t[ 0] = 'H'\t [ 7] = 'W'\n";
            std::cout << "\t\t[ 1] = 'e'\t [ 8] = 'o'\n";
            std::cout << "\t\t[ 2] = 'l'\t [ 9] = 'r'\n";
            std::cout << "\t\t[ 3] = 'l'\t [10] = 'l'\n";
            std::cout << "\t\t[ 4] = 'o'\t [11] = 'd'\n";
            std::cout << "\t\t[ 5] = ','\t [12] = '!'\n";
            std::cout << "\t\t[ 6] = ' '\n\n";

            std::cout << "[DESCRIPTION] Encryption & Decryption is performed one character at a time\n\n";

            std::cout << "[DESCRIPTION] Two auxiliary unsigned character variables were created for Encryption & Decryption\n";
            std::cout << "\t\tunsigned char a, b;\n\n";

            std::cout << "[DESCRIPTION] The following actions are performed for each character\n";
            std::cout << "\t\ta = b = text_msg[n]\n";
            std::cout << "\t\ta = a << 4\n";
            std::cout << "\t\tb = b >> 4\n";
            std::cout << "\t\ta = b = ~(a | b) - 1\n";
            std::cout << "\t\ta = a << 4\n";
            std::cout << "\t\tb = b >> 4\n";
            std::cout << "\t\tresult = a | b\n\n";

            std::cout << "[DESCRIPTION] The Encryption or Decryption results for each character form the source string\n";

            return 0;
        }
        if(strcmp(argv[i], "-t") == 0) {
            ask_name = false; continue;
        }
        if(strcmp(argv[i], "-m") == 0) {
            i++;

            if(strcmp(argv[i], "C") == 0) mode = 0;
            else if(strcmp(argv[i], "CPP") == 0) mode = 1;
            else {
                std::cout << "[ERROR] Incorrect string style mode\n";
                return 1;
            }

            continue;
        }
        if(strcmp(argv[i], "-o") == 0) {
            if(f_out) {
                std::cout << "You can use only one output file\n";
                return 2;
            }

            f_out = true; i++;

            fout.open(argv[i], std::ios_base::app);

            if(!fout.is_open()) {
                std::cout << "Can't create or open output file\n";
            }

            continue;
        }

        c_word.push_back(argv[i]);
    }

    if(debug) std::clog << "[DEBUG] Debug output is ON\n\n";

    if(debug) std::clog << "[DEBUG] String mode : " << (mode ? "CPP\n\n" : "C\n\n");

    if(debug) std::clog << "[DEBUG] Output to file is " << (f_out ? "ON\n\n" : "OFF\n\n");

    if(debug) {
        std::clog << "[DEBUG] Words analisys\n";

        for(auto iter : c_word) std::clog << '\t' << iter << '\n';
    }

    if(ask_name) {
        bool set = false; char ans = 0;

        do {
            std::cout << "\nDo you want to set names for strings[y/n] : ";
            ans = static_cast<char>(_getch());

            if(ans == 'n') {
                ask_name = false;
                set = true;
            }
            else if(ans == 'y' || ans == ' ') set = true;
            else std::cout << "Incorrect Answer! Try again!\n\n";
        } while(set == false);
    }

    if(ask_name) {
        auto iter = c_word.begin();

        std::string tmp = "";

        for(std::size_t i{0}; i < c_word.size(); i++) {
            std::cout << "\nEnter name for " << *iter << " : ";
            std::cin >> tmp;

            s_name.push_back(tmp);

            iter++;
        }
    }
    else {
        for(std::size_t i{0}; i < c_word.size(); i++) s_name.push_back("str" + std::to_string(i));

        std::cout << "\n";
    }

    if(debug) std::clog << "[DEBUG] Starting crypt\n\n";

    for(auto & iter : c_word) iter = cryptor::crypt(iter, debug);

    if(debug) std::clog << "[DEBUG] Crypt result\n";

    std::string tmp = ""; auto iter = c_word.begin();
    auto name_iter = s_name.begin();

    for(std::size_t i{0}; i < c_word.size(); i++) {
        std::clog << '\t' << i + 1 << "th - ";

        if(mode) {
            tmp = "std::string " + *name_iter + " = \"" + *iter + "\";";
        }
        else {
            tmp = "char " + *name_iter + "[] = {";

            for(std::size_t j{0}; j < (*iter).length(); j++) {
                if(j != ((*iter).length() - 1)) tmp += std::to_string(static_cast<int>((*iter).at(j))) + ", ";
                else tmp += std::to_string(static_cast<int>((*iter).at(j))) + ", 0 };";
            }
        }

        std::clog << tmp << '\n';

        if(f_out) fout << tmp << '\n';

        iter++; name_iter++;
    }

    if(f_out) fout.close();

	return 0;
}